

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall
InterpGCTest_Collect_DeepRecursion_Test::TestBody(InterpGCTest_Collect_DeepRecursion_Test *this)

{
  Limits limits;
  bool bVar1;
  Table *this_00;
  Table *this_01;
  Ref ref;
  char *pcVar2;
  AssertHelper local_170;
  Message local_168;
  Index local_160;
  uint local_154;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_1;
  Message local_138;
  Index local_130;
  unsigned_long local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar;
  TableType local_100;
  undefined1 local_d0 [8];
  Ptr new_table;
  size_t i;
  undefined1 local_80 [8];
  Ptr prev_table;
  undefined8 local_60;
  undefined8 local_58;
  ValueType local_50;
  undefined1 local_48 [8];
  TableType tt;
  size_t table_count;
  InterpGCTest_Collect_DeepRecursion_Test *this_local;
  
  tt.limits.has_max = true;
  tt.limits.is_shared = false;
  tt.limits.is_64 = false;
  tt.limits._19_5_ = 0;
  wabt::Type::Type(&local_50,ExternRef);
  wabt::Limits::Limits((Limits *)&prev_table.root_index_,1);
  limits.max = local_60;
  limits.initial = prev_table.root_index_;
  limits._16_8_ = local_58;
  wabt::interp::TableType::TableType((TableType *)local_48,local_50,limits);
  wabt::interp::TableType::TableType((TableType *)&i,(TableType *)local_48);
  wabt::interp::Table::New
            ((Ptr *)local_80,&(this->super_InterpGCTest).super_InterpTest.store_,(TableType *)&i);
  wabt::interp::TableType::~TableType((TableType *)&i);
  for (new_table.root_index_ = 1; new_table.root_index_ < 0x41;
      new_table.root_index_ = new_table.root_index_ + 1) {
    wabt::interp::TableType::TableType(&local_100,(TableType *)local_48);
    wabt::interp::Table::New
              ((Ptr *)local_d0,&(this->super_InterpGCTest).super_InterpTest.store_,&local_100);
    wabt::interp::TableType::~TableType(&local_100);
    this_00 = wabt::interp::RefPtr<wabt::interp::Table>::operator->
                        ((RefPtr<wabt::interp::Table> *)local_d0);
    this_01 = wabt::interp::RefPtr<wabt::interp::Table>::operator->
                        ((RefPtr<wabt::interp::Table> *)local_80);
    ref = wabt::interp::Object::self((Object *)this_01);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ =
         wabt::interp::Table::Set(this_00,&(this->super_InterpGCTest).super_InterpTest.store_,0,ref)
    ;
    wabt::interp::RefPtr<wabt::interp::Table>::reset((RefPtr<wabt::interp::Table> *)local_80);
    wabt::interp::RefPtr<wabt::interp::Table>::operator=
              ((RefPtr<wabt::interp::Table> *)local_80,(RefPtr<wabt::interp::Table> *)local_d0);
    wabt::interp::RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_d0);
  }
  wabt::interp::Store::Collect(&(this->super_InterpGCTest).super_InterpTest.store_);
  local_128 = 0x42;
  local_130 = wabt::interp::Store::object_count(&(this->super_InterpGCTest).super_InterpTest.store_)
  ;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_120,"table_count + 1","store_.object_count()",&local_128,&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x2d4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  wabt::interp::RefPtr<wabt::interp::Table>::reset((RefPtr<wabt::interp::Table> *)local_80);
  wabt::interp::Store::Collect(&(this->super_InterpGCTest).super_InterpTest.store_);
  local_154 = 1;
  local_160 = wabt::interp::Store::object_count(&(this->super_InterpGCTest).super_InterpTest.store_)
  ;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_150,"1u","store_.object_count()",&local_154,&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x2da,pcVar2);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  wabt::interp::RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_80);
  wabt::interp::TableType::~TableType((TableType *)local_48);
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_DeepRecursion) {
  const size_t table_count = 65;

  TableType tt = TableType{ValueType::ExternRef, Limits{1}};

  // Create a chain of tables, where each contains
  // a single reference to the next table.

  Table::Ptr prev_table = Table::New(store_, tt);

  for (size_t i = 1; i < table_count; i++) {
    Table::Ptr new_table = Table::New(store_, tt);

    new_table->Set(store_, 0, prev_table->self());

    prev_table.reset();
    prev_table = std::move(new_table);
  }

  store_.Collect();
  EXPECT_EQ(table_count + 1, store_.object_count());

  // Remove the last root, now all should be removed.
  prev_table.reset();

  store_.Collect();
  EXPECT_EQ(1u, store_.object_count());
}